

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86_avx::create_pipeline_int8_x86(Convolution_x86_avx *this,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [16];
  char cVar3;
  char cVar4;
  char cVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined4 kernel_w;
  undefined4 kernel_h;
  float *pfVar9;
  int *piVar10;
  Allocator *pAVar11;
  int iVar12;
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  Option *pOVar15;
  bool bVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int k;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  short *psVar26;
  undefined1 *puVar27;
  long lVar28;
  int k_1;
  uint uVar29;
  uint uVar30;
  size_t sVar32;
  int kk;
  ulong uVar33;
  long lVar34;
  void *pvVar35;
  void *pvVar36;
  char *pcVar37;
  long lVar38;
  int i;
  ulong uVar39;
  undefined1 *puVar40;
  long lVar41;
  undefined1 *puVar42;
  uint uVar43;
  int iVar44;
  short *psVar45;
  int iVar46;
  uint uVar47;
  ulong uVar48;
  int iVar49;
  undefined1 auVar50 [16];
  float fVar51;
  int TILE_N;
  int TILE_K;
  Mat m;
  int TILE_K_1;
  int TILE_M;
  uint local_240;
  long local_220;
  long local_218;
  uint local_20c;
  short *local_208;
  int local_1fc;
  undefined1 local_1f8 [40];
  undefined1 local_1d0 [16];
  int local_1c0;
  size_t local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  Mat local_198;
  Mat *local_150;
  long local_148;
  long local_140;
  short *local_138;
  long local_130;
  long local_128;
  uint local_11c;
  long local_118;
  Option *local_110;
  long local_108;
  undefined8 local_100;
  Mat local_f8;
  undefined8 local_b0;
  long local_a8;
  long local_a0;
  ulong local_98;
  uint local_90;
  int local_8c;
  int local_88;
  int local_84;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  ulong uVar31;
  
  kernel_w = (this->super_Convolution).kernel_w;
  kernel_h = (this->super_Convolution).kernel_h;
  auVar50._4_4_ = kernel_h;
  auVar50._0_4_ = kernel_w;
  uVar29 = kernel_h * kernel_w;
  uVar31 = (ulong)uVar29;
  uVar48 = (long)(this->super_Convolution).weight_data_size / (long)(int)uVar29;
  uVar43 = (this->super_Convolution).num_output;
  local_1b0 = (ulong)(int)uVar43;
  uVar33 = (ulong)uVar43;
  uVar48 = (long)((ulong)(uint)((int)uVar48 >> 0x1f) << 0x20 | uVar48 & 0xffffffff) /
           (long)(int)uVar43;
  uVar25 = uVar48 & 0xffffffff;
  local_240 = (uint)uVar48;
  if ((opt->use_winograd23_convolution == false) && (opt->use_winograd43_convolution != true)) {
    bVar16 = false;
  }
  else {
    bVar16 = 8 < (int)uVar43 || 8 < (int)local_240;
  }
  auVar2._0_4_ = (this->super_Convolution).dilation_w;
  auVar2._4_4_ = (this->super_Convolution).dilation_h;
  auVar2._8_4_ = (this->super_Convolution).stride_w;
  auVar2._12_4_ = (this->super_Convolution).stride_h;
  auVar50._8_8_ = 0;
  auVar50 = vpunpcklqdq_avx(auVar50,auVar2);
  local_150 = &(this->super_Convolution).weight_data;
  local_1a0 = uVar33;
  local_110 = opt;
  if ((((auVar50 == _DAT_005f0fc0) && ((this->super_Convolution).stride_w == 1)) &&
      ((this->super_Convolution).stride_h == 1)) &&
     ((opt->use_winograd_convolution != false && (bVar16)))) {
    bVar16 = opt->use_winograd43_convolution;
    iVar17 = cpu_support_x86_avx2();
    pOVar15 = local_110;
    iVar49 = (int)local_1a0;
    if (bVar16 == true) {
      if (iVar17 != 0) {
        conv3x3s1_winograd43_transform_kernel_int8_avx2
                  (local_150,&this->weight_winograd43_data,local_240,(int)local_1b0,local_110);
        goto LAB_00203454;
      }
      get_optimal_tile_mnk_int8
                (iVar49,0,local_240,(int *)&local_20c,&local_1fc,(int *)&local_11c,
                 local_110->num_threads);
      uVar43 = local_11c;
      iVar17 = (int)(iVar49 + local_20c + -1) / (int)local_20c;
      iVar49 = local_20c * local_11c;
      local_198.cstep = 0;
      local_198.data = (void *)0x0;
      local_198.refcount._0_4_ = 0;
      local_198.refcount._4_4_ = 0;
      local_198.elemsize._0_4_ = 0;
      local_198.elemsize._4_4_ = 0;
      local_198.elempack = 0;
      local_198.allocator = (Allocator *)0x0;
      local_198.dims = 0;
      local_198.w = 0;
      local_198.h = 0;
      local_198.d = 0;
      local_198.c = 0;
      Mat::create(&local_198,iVar49 * 0x24,1,pOVar15->num_threads,4,(Allocator *)0x0);
      Mat::create(&this->weight_winograd43_data,iVar49,0x24,
                  (int)(uVar43 + local_240 + -1) / (int)uVar43,iVar17,4,(Allocator *)0x0);
      if (0 < iVar17) {
        local_1a8 = CONCAT44(local_1a8._4_4_,local_240 * 9);
        iVar49 = 0;
        local_148 = CONCAT44(local_148._4_4_,iVar17);
        do {
          iVar17 = local_20c * iVar49;
          iVar18 = get_omp_thread_num();
          local_140 = CONCAT44(local_140._4_4_,iVar49);
          uVar48 = CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
          local_1f8._0_8_ = (long)iVar18 * local_198.cstep * uVar48 + (long)local_198.data;
          local_1f8._8_4_ = 0;
          local_1f8._12_4_ = 0;
          local_1f8._16_4_ = (undefined4)local_198.elemsize;
          local_1f8._20_4_ = local_198.elemsize._4_4_;
          local_1f8._24_4_ = local_198.elempack;
          local_1f8._32_8_ = local_198.allocator;
          auVar13._4_8_ = local_1d0._8_8_;
          auVar13._0_4_ = local_198.w;
          local_1d0._0_8_ = auVar13._0_8_ << 0x20;
          local_1d0._8_4_ = local_198.h;
          local_1d0._12_4_ = 1;
          local_1c0 = local_198.d;
          local_1d0._0_4_ = local_198.dims + -1;
          local_1b8 = (uVar48 * (long)local_198.h * (long)local_198.w + 0xf & 0xfffffffffffffff0) /
                      uVar48;
          if (local_198.dims == 4) {
            local_1b8 = (long)local_198.h * (long)local_198.w;
          }
          if (0 < (int)local_240) {
            uVar43 = (int)local_1a0 - iVar17;
            if ((int)local_20c < (int)uVar43) {
              uVar43 = local_20c;
            }
            local_130 = (long)(int)local_11c;
            local_138 = (short *)(long)(iVar17 / (int)local_20c);
            uVar48 = 0;
            lVar20 = local_130;
            local_208 = (short *)local_1f8._0_8_;
            do {
              lVar28 = local_130;
              uVar29 = local_240 - (int)uVar48;
              if ((int)(uint)lVar20 < (int)uVar29) {
                uVar29 = (uint)lVar20;
              }
              if (0 < (int)uVar43) {
                pvVar35 = local_150->data;
                uVar25 = 0;
                psVar45 = local_208;
                do {
                  if (0 < (int)uVar29) {
                    uVar33 = 0;
                    do {
                      pcVar37 = (char *)((long)pvVar35 +
                                        (uVar33 + uVar48) * 9 +
                                        (long)((iVar17 + (int)uVar25) * (int)local_1a8));
                      lVar20 = 0;
                      do {
                        cVar3 = *pcVar37;
                        cVar4 = pcVar37[1];
                        cVar5 = pcVar37[2];
                        *(short *)((long)&local_f8.data + lVar20 * 2) = cVar3 * 6;
                        *(short *)((long)&local_f8.data + lVar20 * 2 + 6) =
                             -(cVar5 * 4 + cVar4 * 4 + cVar3 * 4);
                        *(short *)((long)&local_f8.refcount + lVar20 * 2 + 4) =
                             cVar4 * 4 + cVar3 * -4 + cVar5 * -4;
                        *(short *)((long)&local_f8.elemsize + lVar20 * 2 + 2) =
                             (short)cVar3 + cVar4 * 2 + cVar5 * 4;
                        *(short *)((long)&local_f8.elempack + lVar20 * 2) =
                             ((short)cVar3 - ((short)cVar4 + (short)cVar4)) + cVar5 * 4;
                        *(short *)(&local_f8.field_0x1e + lVar20 * 2) = cVar5 * 6;
                        pcVar37 = pcVar37 + 3;
                        lVar20 = lVar20 + 1;
                      } while (lVar20 != 3);
                      lVar20 = 4;
                      do {
                        sVar6 = *(short *)((long)&local_100 + lVar20 + 4);
                        sVar7 = *(short *)((long)&local_100 + lVar20 + 6);
                        sVar8 = *(short *)((long)&local_f8.data + lVar20);
                        *psVar45 = sVar6 * 6;
                        psVar45[1] = -(sVar8 * 4 + sVar7 * 4 + sVar6 * 4);
                        psVar45[2] = sVar7 * 4 + sVar6 * -4 + sVar8 * -4;
                        psVar45[3] = sVar6 + sVar7 * 2 + sVar8 * 4;
                        psVar45[4] = sVar6 + sVar7 * -2 + sVar8 * 4;
                        psVar45[5] = sVar8 * 6;
                        psVar45 = psVar45 + 6;
                        lVar20 = lVar20 + 6;
                      } while (lVar20 != 0x28);
                      uVar33 = uVar33 + 1;
                    } while (uVar33 != uVar29);
                  }
                  uVar25 = uVar25 + 1;
                } while (uVar25 != uVar43);
              }
              local_f8.w = (this->weight_winograd43_data).w;
              local_f8.elemsize = (this->weight_winograd43_data).elemsize;
              local_f8.h = (this->weight_winograd43_data).h;
              local_f8.elempack = (this->weight_winograd43_data).elempack;
              local_f8.allocator = (this->weight_winograd43_data).allocator;
              local_f8.cstep = (long)local_f8.h * (long)local_f8.w;
              local_f8.data =
                   (void *)((long)(this->weight_winograd43_data).data +
                           local_f8.elemsize * local_f8.cstep *
                           (long)(int)((long)((ulong)(uint)((int)uVar48 >> 0x1f) << 0x20 |
                                             uVar48 & 0xffffffff) / (long)(int)local_130) +
                           (this->weight_winograd43_data).cstep * (long)local_138 *
                           local_f8.elemsize);
              local_f8.refcount._0_4_ = 0;
              local_f8.refcount._4_4_ = 0;
              local_f8.dims = 2;
              local_f8.d = 1;
              local_f8.c = 1;
              pack_A_tile_int8((Mat *)local_1f8,&local_f8,0x24,uVar43,uVar29);
              local_f8.cstep = 0;
              local_f8.data._0_4_ = 0;
              local_f8.data._4_4_ = 0;
              local_f8.refcount._0_4_ = 0;
              local_f8.refcount._4_4_ = 0;
              local_f8.elemsize = 0;
              local_f8.elempack = 0;
              local_f8.dims = 0;
              local_f8.w = 0;
              local_f8.h = 0;
              local_f8.d = 0;
              local_f8.c = 0;
              uVar48 = uVar48 + lVar28;
              lVar20 = lVar28;
            } while ((long)uVar48 < (long)(int)local_240);
          }
          piVar10 = (int *)CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
          iVar17 = (int)local_148;
          iVar49 = (int)local_140;
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if ((Allocator *)local_1f8._32_8_ == (Allocator *)0x0) {
                if ((short *)local_1f8._0_8_ != (short *)0x0) {
                  free((void *)local_1f8._0_8_);
                }
              }
              else {
                (*(*(_func_int ***)local_1f8._32_8_)[3])();
              }
            }
          }
          local_1b8 = 0;
          local_1f8._0_8_ = (void *)0x0;
          local_1f8._8_4_ = 0;
          local_1f8._12_4_ = 0;
          local_1f8._16_4_ = 0;
          local_1f8._20_4_ = 0;
          local_1f8._24_4_ = 0;
          local_1d0 = (undefined1  [16])0x0;
          local_1c0 = 0;
          iVar49 = iVar49 + 1;
        } while (iVar49 != iVar17);
      }
      piVar10 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_198.allocator == (Allocator *)0x0) {
LAB_00203015:
            if (local_198.data != (void *)0x0) {
              free(local_198.data);
            }
          }
          else {
            (*(local_198.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      if (iVar17 != 0) {
        conv3x3s1_winograd23_transform_kernel_int8_avx2
                  (local_150,&this->weight_winograd23_data,local_240,(int)local_1b0,local_110);
        goto LAB_00203454;
      }
      get_optimal_tile_mnk_int8
                (iVar49,0,local_240,(int *)&local_20c,&local_1fc,(int *)&local_11c,
                 local_110->num_threads);
      uVar43 = local_11c;
      iVar17 = (int)(iVar49 + local_20c + -1) / (int)local_20c;
      iVar49 = local_20c * local_11c;
      local_198.cstep = 0;
      local_198.data = (void *)0x0;
      local_198.refcount._0_4_ = 0;
      local_198.refcount._4_4_ = 0;
      local_198.elemsize._0_4_ = 0;
      local_198.elemsize._4_4_ = 0;
      local_198.elempack = 0;
      local_198.allocator = (Allocator *)0x0;
      local_198.dims = 0;
      local_198.w = 0;
      local_198.h = 0;
      local_198.d = 0;
      local_198.c = 0;
      Mat::create(&local_198,iVar49 * 0x10,1,pOVar15->num_threads,2,(Allocator *)0x0);
      Mat::create(&this->weight_winograd23_data,iVar49,0x10,
                  (int)(uVar43 + local_240 + -1) / (int)uVar43,iVar17,2,(Allocator *)0x0);
      if (0 < iVar17) {
        local_130 = (long)(int)local_240;
        iVar49 = 0;
        local_208 = (short *)CONCAT44(local_208._4_4_,iVar17);
        do {
          iVar17 = local_20c * iVar49;
          iVar18 = get_omp_thread_num();
          uVar43 = local_11c;
          uVar48 = CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
          local_1f8._0_8_ = (long)iVar18 * local_198.cstep * uVar48 + (long)local_198.data;
          local_1f8._8_4_ = 0;
          local_1f8._12_4_ = 0;
          local_1f8._16_4_ = (undefined4)local_198.elemsize;
          local_1f8._20_4_ = local_198.elemsize._4_4_;
          local_1f8._24_4_ = local_198.elempack;
          local_1f8._32_8_ = local_198.allocator;
          auVar14._4_8_ = local_1d0._8_8_;
          auVar14._0_4_ = local_198.w;
          local_1d0._0_8_ = auVar14._0_8_ << 0x20;
          local_1d0._8_4_ = local_198.h;
          local_1d0._12_4_ = 1;
          local_1c0 = local_198.d;
          local_1d0._0_4_ = local_198.dims + -1;
          local_1b8 = (uVar48 * (long)local_198.h * (long)local_198.w + 0xf & 0xfffffffffffffff0) /
                      uVar48;
          if (local_198.dims == 4) {
            local_1b8 = (long)local_198.h * (long)local_198.w;
          }
          if (0 < (int)local_240) {
            uVar29 = (int)local_1a0 - iVar17;
            if ((int)local_20c < (int)uVar29) {
              uVar29 = local_20c;
            }
            lVar20 = (long)(int)local_11c;
            local_1a8 = (ulong)(iVar17 / (int)local_20c);
            uVar48 = 0;
            local_138 = (short *)local_1f8._0_8_;
            do {
              uVar30 = local_240 - (int)uVar48;
              if ((int)uVar43 < (int)uVar30) {
                uVar30 = uVar43;
              }
              if (0 < (int)uVar29) {
                pvVar35 = local_150->data;
                uVar25 = 0;
                psVar45 = local_138;
                do {
                  if (0 < (int)uVar30) {
                    uVar33 = 0;
                    do {
                      pcVar37 = (char *)((long)pvVar35 +
                                        (uVar33 + uVar48) * 9 +
                                        (long)(int)((iVar17 + (int)uVar25) * local_240 * 9));
                      lVar28 = 0;
                      do {
                        cVar3 = *pcVar37;
                        cVar4 = pcVar37[1];
                        cVar5 = pcVar37[2];
                        *(short *)((long)&local_f8.data + lVar28 * 2) = cVar3 * 2;
                        *(short *)((long)&local_f8.data + lVar28 * 2 + 6) =
                             (short)cVar4 + (short)cVar3 + (short)cVar5;
                        *(short *)((long)&local_f8.refcount + lVar28 * 2 + 4) =
                             ((short)cVar3 - (short)cVar4) + (short)cVar5;
                        *(short *)((long)&local_f8.elemsize + lVar28 * 2 + 2) =
                             (short)cVar5 + (short)cVar5;
                        pcVar37 = pcVar37 + 3;
                        lVar28 = lVar28 + 1;
                      } while (lVar28 != 3);
                      lVar28 = 4;
                      do {
                        sVar6 = *(short *)((long)&local_100 + lVar28 + 4);
                        sVar7 = *(short *)((long)&local_100 + lVar28 + 6);
                        sVar8 = *(short *)((long)&local_f8.data + lVar28);
                        *psVar45 = sVar6 * 2;
                        psVar45[1] = sVar7 + sVar6 + sVar8;
                        psVar45[2] = (sVar6 - sVar7) + sVar8;
                        psVar45[3] = sVar8 * 2;
                        psVar45 = psVar45 + 4;
                        lVar28 = lVar28 + 6;
                      } while (lVar28 != 0x1c);
                      uVar33 = uVar33 + 1;
                    } while (uVar33 != uVar30);
                  }
                  uVar25 = uVar25 + 1;
                } while (uVar25 != uVar29);
              }
              local_f8.w = (this->weight_winograd23_data).w;
              local_f8.elemsize = (this->weight_winograd23_data).elemsize;
              local_f8.h = (this->weight_winograd23_data).h;
              local_f8.elempack = (this->weight_winograd23_data).elempack;
              local_f8.allocator = (this->weight_winograd23_data).allocator;
              local_f8.cstep = (long)local_f8.h * (long)local_f8.w;
              local_f8.data =
                   (void *)((long)(this->weight_winograd23_data).data +
                           local_f8.elemsize * local_f8.cstep *
                           (long)(int)((long)((ulong)(uint)((int)uVar48 >> 0x1f) << 0x20 |
                                             uVar48 & 0xffffffff) / (long)(int)uVar43) +
                           (this->weight_winograd23_data).cstep * local_1a8 * local_f8.elemsize);
              local_f8.refcount._0_4_ = 0;
              local_f8.refcount._4_4_ = 0;
              local_f8.dims = 2;
              local_f8.d = 1;
              local_f8.c = 1;
              pack_A_tile_int8((Mat *)local_1f8,&local_f8,0x10,uVar29,uVar30);
              local_f8.cstep = 0;
              local_f8.data._0_4_ = 0;
              local_f8.data._4_4_ = 0;
              local_f8.refcount._0_4_ = 0;
              local_f8.refcount._4_4_ = 0;
              local_f8.elemsize = 0;
              local_f8.elempack = 0;
              local_f8.dims = 0;
              local_f8.w = 0;
              local_f8.h = 0;
              local_f8.d = 0;
              local_f8.c = 0;
              uVar48 = uVar48 + lVar20;
            } while ((long)uVar48 < local_130);
          }
          piVar10 = (int *)CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
          iVar17 = (int)local_208;
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if ((Allocator *)local_1f8._32_8_ == (Allocator *)0x0) {
                if ((short *)local_1f8._0_8_ != (short *)0x0) {
                  free((void *)local_1f8._0_8_);
                }
              }
              else {
                (*(*(_func_int ***)local_1f8._32_8_)[3])();
              }
            }
          }
          local_1b8 = 0;
          local_1f8._0_8_ = (void *)0x0;
          local_1f8._8_4_ = 0;
          local_1f8._12_4_ = 0;
          local_1f8._16_4_ = 0;
          local_1f8._20_4_ = 0;
          local_1f8._24_4_ = 0;
          local_1d0 = (undefined1  [16])0x0;
          local_1c0 = 0;
          iVar49 = iVar49 + 1;
        } while (iVar49 != iVar17);
      }
      piVar10 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_198.allocator == (Allocator *)0x0) goto LAB_00203015;
          (*(local_198.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_198.cstep = 0;
    local_198.data = (void *)0x0;
    local_198.refcount._0_4_ = 0;
    local_198.refcount._4_4_ = 0;
    local_198.elemsize._0_4_ = 0;
    local_198.elemsize._4_4_ = 0;
    local_198.elempack = 0;
    local_198.dims = 0;
    local_198.w = 0;
    local_198.h = 0;
    local_198.d = 0;
    local_198.c = 0;
    goto LAB_00203454;
  }
  if (opt->use_sgemm_convolution != true) {
    iVar17 = cpu_support_x86_avx2();
    uVar33 = local_1a0;
    if (iVar17 != 0) {
      convolution_transform_kernel_packed_int8_avx2
                (local_150,&this->weight_data_tm,local_240,(uint)local_1b0,kernel_w,kernel_h);
      goto LAB_00203454;
    }
    uVar30 = (uint)local_1a0;
    uVar43 = local_240;
    if ((int)uVar30 < 4) {
      if ((int)uVar30 < 2) {
        uVar47 = (uint)local_1b0;
        if (7 < (int)local_240) {
          uVar43 = (local_240 & 1) + (int)(uVar25 >> 3) + ((uint)(uVar25 >> 1) & 3);
          goto LAB_0020300a;
        }
        if (1 < (int)local_240) {
          uVar43 = local_240 - (int)(uVar25 >> 1);
          uVar47 = uVar30;
          goto LAB_00203640;
        }
        sVar32 = 1;
        iVar17 = 1;
      }
      else if ((int)local_240 < 8) {
        if (1 < (int)local_240) {
          uVar43 = local_240 - (int)(uVar25 >> 1);
          uVar47 = (uVar30 & 1) + 1;
          goto LAB_002035e3;
        }
        uVar47 = (uVar30 & 1) + 1;
LAB_00203640:
        sVar32 = 2;
        iVar17 = 2;
      }
      else {
        sVar32 = 0x10;
        iVar17 = 0x10;
        uVar43 = (local_240 & 1) + (int)(uVar25 >> 3) + ((uint)(uVar25 >> 1) & 3);
        uVar47 = (uVar30 & 1) + 1;
      }
    }
    else if ((int)local_240 < 8) {
      if ((int)local_240 < 2) {
        uVar47 = (uVar30 & 1) + ((uint)(local_1b0 >> 2) & 0x3fffffff) +
                 (uint)((uVar30 >> 1 & 1) != 0);
LAB_002035e3:
        sVar32 = 4;
        iVar17 = 4;
      }
      else {
        uVar43 = local_240 - (int)(uVar25 >> 1);
        uVar47 = (uVar30 & 1) + ((uint)(local_1a0 >> 2) & 0x3fffffff) +
                 (uint)(((uint)local_1b0 >> 1 & 1) != 0);
LAB_0020300a:
        sVar32 = 8;
        iVar17 = 8;
      }
    }
    else {
      sVar32 = 0x20;
      iVar17 = 0x20;
      uVar43 = (local_240 & 1) + (int)(uVar25 >> 3) + ((uint)(uVar25 >> 1) & 3);
      uVar47 = ((uint)local_1b0 & 1) + ((uint)(local_1a0 >> 2) & 0x3fffffff) +
               (uint)((uVar30 >> 1 & 1) != 0);
    }
    Mat::create(&this->weight_data_tm,uVar29,uVar43,uVar47,sVar32,iVar17,(Allocator *)0x0);
    uVar25 = 0;
    local_118 = (long)(int)uVar29;
    if (3 < (int)uVar30) {
      iVar44 = local_240 * uVar29;
      lVar20 = (long)(int)(uVar29 * 2);
      local_140 = (long)(int)(uVar29 * 8);
      local_b0 = CONCAT44(local_b0._4_4_,local_240) & 0xfffffffffffffff8;
      iVar18 = local_240 * uVar29;
      iVar17 = iVar18 * 4;
      local_a8 = CONCAT44(local_a8._4_4_,iVar17);
      iVar49 = iVar18 * 3;
      iVar18 = iVar18 * 2;
      local_a0 = CONCAT44(local_a0._4_4_,iVar44);
      uVar39 = 0;
      uVar25 = 0;
      iVar19 = iVar44;
      do {
        local_98 = uVar25;
        local_100 = uVar39;
        pvVar35 = (this->super_Convolution).weight_data.data;
        uVar43 = (uint)local_98;
        local_220 = (long)(int)(iVar44 * uVar43) + (long)pvVar35;
        local_218 = (long)(int)((uVar43 | 1) * iVar44) + (long)pvVar35;
        psVar45 = (short *)((long)(int)((uVar43 | 2) * iVar44) + (long)pvVar35);
        uVar25 = (long)(int)((uVar43 | 3) * iVar44) + (long)pvVar35;
        puVar40 = (undefined1 *)
                  ((local_98 >> 2) * (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize
                  + (long)(this->weight_data_tm).data);
        local_148 = CONCAT44(local_148._4_4_,iVar49);
        local_128 = CONCAT44(local_128._4_4_,iVar18);
        local_108 = CONCAT44(local_108._4_4_,iVar19);
        iVar46 = (int)local_100;
        if ((int)local_240 < 8) {
          uVar33 = 0;
        }
        else {
          lVar28 = 0;
          psVar26 = (short *)0x0;
          local_208 = psVar45;
          do {
            if (0 < (int)uVar29) {
              uVar33 = 0;
              lVar34 = lVar28;
              do {
                puVar42 = puVar40;
                lVar23 = 0;
                lVar41 = lVar34;
                do {
                  puVar42[lVar23] = *(undefined1 *)((long)pvVar35 + lVar41 + iVar46);
                  puVar42[lVar23 + 1] = *(undefined1 *)((long)pvVar35 + lVar41 + iVar46 + local_118)
                  ;
                  puVar42[lVar23 + 2] = *(undefined1 *)((long)pvVar35 + lVar41 + iVar19);
                  puVar42[lVar23 + 3] = *(undefined1 *)((long)pvVar35 + lVar41 + iVar19 + local_118)
                  ;
                  puVar42[lVar23 + 4] = *(undefined1 *)((long)pvVar35 + lVar41 + iVar18);
                  puVar42[lVar23 + 5] = *(undefined1 *)((long)pvVar35 + lVar41 + iVar18 + local_118)
                  ;
                  puVar42[lVar23 + 6] = *(undefined1 *)((long)pvVar35 + lVar41 + iVar49);
                  puVar42[lVar23 + 7] = *(undefined1 *)((long)pvVar35 + lVar41 + iVar49 + local_118)
                  ;
                  lVar23 = lVar23 + 8;
                  lVar41 = lVar41 + lVar20;
                } while ((int)lVar23 != 0x20);
                uVar33 = uVar33 + 1;
                lVar34 = lVar34 + 1;
                puVar40 = puVar42 + lVar23;
              } while (uVar33 != uVar31);
              puVar40 = puVar42 + lVar23;
              local_1a8 = uVar25;
              local_138 = psVar26;
              local_130 = lVar28;
            }
            local_220 = local_220 + local_140;
            local_218 = local_218 + local_140;
            psVar45 = (short *)((long)local_208 + local_140);
            uVar25 = uVar25 + local_140;
            iVar12 = (int)psVar26;
            lVar28 = lVar28 + local_140;
            psVar26 = (short *)(ulong)(iVar12 + 8);
            local_208 = psVar45;
          } while (iVar12 + 0xf < (int)local_240);
          uVar33 = uVar48 & 0xfffffff8;
        }
        uVar43 = (uint)uVar33;
        if ((int)(uVar43 | 1) < (int)local_240) {
          lVar28 = uVar25 + local_118;
          lVar34 = (long)psVar45 + local_118;
          lVar41 = local_218 + local_118;
          lVar23 = local_220 + local_118;
          do {
            if (0 < (int)uVar29) {
              uVar39 = 0;
              puVar42 = puVar40;
              do {
                puVar27 = puVar42;
                puVar42 = puVar40 + uVar39 * 8;
                *puVar42 = *(undefined1 *)(local_220 + uVar39);
                puVar42[1] = *(undefined1 *)(lVar23 + uVar39);
                puVar42[2] = *(undefined1 *)(local_218 + uVar39);
                puVar42[3] = *(undefined1 *)(lVar41 + uVar39);
                puVar42[4] = *(undefined1 *)((long)psVar45 + uVar39);
                puVar42[5] = *(undefined1 *)(lVar34 + uVar39);
                puVar42[6] = *(undefined1 *)(uVar25 + uVar39);
                puVar42[7] = *(undefined1 *)(lVar28 + uVar39);
                uVar39 = uVar39 + 1;
                puVar42 = puVar42 + 8;
              } while (uVar31 != uVar39);
              puVar40 = puVar27 + 8;
              local_1a8 = uVar33;
            }
            local_220 = local_220 + lVar20;
            local_218 = local_218 + lVar20;
            psVar45 = (short *)((long)psVar45 + lVar20);
            uVar25 = uVar25 + lVar20;
            iVar12 = (int)uVar33;
            uVar43 = iVar12 + 2;
            lVar28 = lVar28 + lVar20;
            lVar34 = lVar34 + lVar20;
            lVar41 = lVar41 + lVar20;
            lVar23 = lVar23 + lVar20;
            uVar33 = (ulong)uVar43;
          } while (iVar12 + 3 < (int)local_240);
        }
        if ((int)uVar43 < (int)local_240) {
          do {
            if (0 < (int)uVar29) {
              uVar33 = 0;
              do {
                *puVar40 = *(undefined1 *)(local_220 + uVar33);
                puVar40[1] = *(undefined1 *)(local_218 + uVar33);
                puVar40[2] = *(undefined1 *)((long)psVar45 + uVar33);
                puVar40[3] = *(undefined1 *)(uVar25 + uVar33);
                puVar40 = puVar40 + 4;
                uVar33 = uVar33 + 1;
              } while (uVar31 != uVar33);
            }
            uVar43 = uVar43 + 1;
          } while (uVar43 != local_240);
        }
        uVar25 = local_98 + 4;
        iVar19 = iVar19 + iVar17;
        iVar18 = iVar18 + iVar17;
        iVar49 = iVar49 + iVar17;
        uVar39 = (ulong)(uint)(iVar46 + iVar17);
        uVar33 = local_1a0;
      } while (local_98 + 7 < local_1a0);
    }
    uVar30 = (uint)uVar25;
    uVar43 = uVar30 | 1;
    if ((int)uVar43 < (int)uVar33) {
      uVar47 = local_240 * uVar29;
      local_50 = (ulong)uVar47;
      local_58 = (long)(int)(uVar29 * 2);
      local_60 = (long)(int)(uVar29 * 3);
      local_68 = (long)(int)(uVar29 * 4);
      local_70 = (long)(int)(uVar29 * 5);
      local_78 = (long)(int)(uVar29 * 6);
      local_38 = (long)(int)(uVar29 * 8);
      local_80 = (long)(int)(uVar29 * 7);
      local_90 = local_240 & 0xfffffff8;
      local_8c = uVar47 * 2;
      uVar30 = uVar30 * uVar47;
      uVar48 = uVar25 & 0xffffffff;
      iVar17 = uVar47 * uVar43;
      do {
        local_88 = iVar17;
        local_40 = uVar48;
        pvVar35 = (this->super_Convolution).weight_data.data;
        lVar20 = (long)(int)(uVar47 * (uint)local_40) + (long)pvVar35;
        psVar45 = (short *)((long)(int)(uVar43 * uVar47) + (long)pvVar35);
        puVar40 = (undefined1 *)
                  ((ulong)(((uint)(local_40 >> 2) & 0x3fffffff) +
                          (uint)(((uint)local_40 >> 1 & 1) != 0)) * (this->weight_data_tm).cstep *
                   (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
        if ((int)local_240 < 8) {
          uVar43 = 0;
        }
        else {
          lVar41 = (long)local_88;
          lVar21 = (long)(int)uVar30;
          local_128 = (long)pvVar35 + lVar41 + local_80;
          lVar28 = (long)pvVar35 + lVar41 + local_78;
          local_100 = (long)pvVar35 + lVar41 + local_60;
          local_108 = (long)pvVar35 + lVar41 + local_58;
          lVar22 = (long)pvVar35 + lVar41 + local_118;
          lVar38 = (long)pvVar35 + lVar21 + local_80;
          local_148 = (long)pvVar35 + lVar21 + local_60;
          uVar48 = (long)pvVar35 + lVar21 + local_58;
          uVar25 = (long)pvVar35 + lVar41 + local_70;
          psVar26 = (short *)((long)pvVar35 + lVar21 + local_118);
          lVar34 = (long)pvVar35 + lVar21 + local_68;
          lVar41 = (long)pvVar35 + lVar41 + local_68;
          lVar23 = (long)pvVar35 + lVar21 + local_70;
          uVar33 = (long)pvVar35 + lVar21 + local_78;
          local_140 = lVar20;
          iVar17 = 0;
          do {
            local_1a8 = uVar33;
            local_130 = lVar23;
            local_a0 = lVar41;
            local_a8 = lVar34;
            local_138 = psVar26;
            local_b0 = uVar25;
            local_98 = uVar48;
            if (0 < (int)uVar29) {
              uVar48 = 0;
              do {
                *puVar40 = *(undefined1 *)(local_140 + uVar48);
                puVar40[1] = *(undefined1 *)((long)local_138 + uVar48);
                puVar40[2] = *(undefined1 *)(local_98 + uVar48);
                puVar40[3] = *(undefined1 *)(local_148 + uVar48);
                puVar40[4] = *(undefined1 *)(local_a8 + uVar48);
                puVar40[5] = *(undefined1 *)(local_130 + uVar48);
                puVar40[6] = *(undefined1 *)(local_1a8 + uVar48);
                puVar40[7] = *(undefined1 *)(lVar38 + uVar48);
                puVar40[8] = *(undefined1 *)((long)psVar45 + uVar48);
                puVar40[9] = *(undefined1 *)(lVar22 + uVar48);
                puVar40[10] = *(undefined1 *)(local_108 + uVar48);
                puVar40[0xb] = *(undefined1 *)(local_100 + uVar48);
                puVar40[0xc] = *(undefined1 *)(local_a0 + uVar48);
                puVar40[0xd] = *(undefined1 *)(local_b0 + uVar48);
                puVar40[0xe] = *(undefined1 *)(lVar28 + uVar48);
                puVar40[0xf] = *(undefined1 *)(local_128 + uVar48);
                puVar40 = puVar40 + 0x10;
                uVar48 = uVar48 + 1;
              } while (uVar31 != uVar48);
            }
            lVar20 = local_140 + local_38;
            psVar45 = (short *)((long)psVar45 + local_38);
            local_84 = iVar17 + 8;
            iVar49 = iVar17 + 0xf;
            local_128 = local_128 + local_38;
            lVar28 = lVar28 + local_38;
            local_100 = local_100 + local_38;
            local_108 = local_108 + local_38;
            lVar22 = lVar22 + local_38;
            lVar38 = lVar38 + local_38;
            local_148 = local_148 + local_38;
            uVar48 = local_98 + local_38;
            uVar25 = local_b0 + local_38;
            psVar26 = (short *)((long)local_138 + local_38);
            lVar34 = local_a8 + local_38;
            lVar41 = local_a0 + local_38;
            lVar23 = local_130 + local_38;
            uVar33 = local_1a8 + local_38;
            uVar43 = local_90;
            local_208 = psVar45;
            local_140 = lVar20;
            local_48 = (ulong)uVar30;
            iVar17 = local_84;
          } while (iVar49 < (int)local_240);
        }
        if ((int)(uVar43 | 1) < (int)local_240) {
          lVar34 = (long)psVar45 + local_118;
          lVar28 = lVar20 + local_118;
          uVar24 = uVar43;
          do {
            if (0 < (int)uVar29) {
              uVar48 = 0;
              do {
                *puVar40 = *(undefined1 *)(lVar20 + uVar48);
                puVar40[1] = *(undefined1 *)((long)psVar45 + uVar48);
                puVar40[2] = *(undefined1 *)(lVar28 + uVar48);
                puVar40[3] = *(undefined1 *)(lVar34 + uVar48);
                puVar40 = puVar40 + 4;
                uVar48 = uVar48 + 1;
              } while (uVar31 != uVar48);
            }
            lVar20 = lVar20 + local_58;
            psVar45 = (short *)((long)psVar45 + local_58);
            uVar43 = uVar24 + 2;
            iVar17 = uVar24 + 3;
            lVar34 = lVar34 + local_58;
            lVar28 = lVar28 + local_58;
            uVar24 = uVar43;
          } while (iVar17 < (int)local_240);
        }
        if ((int)uVar43 < (int)local_240) {
          do {
            if (0 < (int)uVar29) {
              uVar48 = 0;
              do {
                *puVar40 = *(undefined1 *)(lVar20 + uVar48);
                puVar40[1] = *(undefined1 *)((long)psVar45 + uVar48);
                puVar40 = puVar40 + 2;
                uVar48 = uVar48 + 1;
              } while (uVar31 != uVar48);
            }
            uVar43 = uVar43 + 1;
          } while (uVar43 != local_240);
        }
        uVar43 = (uint)(local_40 + 3);
        uVar30 = uVar30 + local_8c;
        uVar48 = local_40 + 2;
        iVar17 = local_88 + local_8c;
      } while ((long)(local_40 + 3) < (long)local_1b0);
      uVar30 = (uint)(local_40 + 2);
      uVar33 = local_1a0;
    }
    if ((int)uVar30 < (int)uVar33) {
      uVar48 = (ulong)uVar30;
      do {
        uVar43 = (uint)uVar48;
        lVar20 = (long)(int)(local_240 * uVar29 * uVar43) +
                 (long)(this->super_Convolution).weight_data.data;
        puVar40 = (undefined1 *)
                  ((this->weight_data_tm).elemsize * (this->weight_data_tm).cstep *
                   (ulong)((uVar43 & 1) + ((uint)(uVar48 >> 2) & 0x3fffffff) +
                          (uint)((uVar43 >> 1 & 1) != 0)) + (long)(this->weight_data_tm).data);
        uVar30 = 0;
        uVar43 = 0;
        if (7 < (int)local_240) {
          do {
            if (0 < (int)uVar29) {
              uVar25 = 0;
              do {
                puVar42 = puVar40;
                puVar40 = (undefined1 *)(lVar20 + uVar25);
                lVar28 = 0;
                do {
                  puVar42[lVar28] = *puVar40;
                  puVar40 = puVar40 + local_118;
                  lVar28 = lVar28 + 1;
                } while ((int)lVar28 != 8);
                uVar25 = uVar25 + 1;
                puVar40 = puVar42 + lVar28;
              } while (uVar25 != uVar31);
              puVar40 = puVar42 + lVar28;
            }
            lVar20 = lVar20 + (int)(uVar29 * 8);
            iVar17 = uVar30 + 0xf;
            uVar30 = uVar30 + 8;
            uVar43 = local_240 & 0xfffffff8;
          } while (iVar17 < (int)local_240);
        }
        if ((int)(uVar43 | 1) < (int)local_240) {
          lVar28 = lVar20 + local_118;
          uVar30 = uVar43;
          do {
            if (0 < (int)uVar29) {
              uVar25 = 0;
              do {
                *puVar40 = *(undefined1 *)(lVar20 + uVar25);
                puVar40[1] = *(undefined1 *)(lVar28 + uVar25);
                puVar40 = puVar40 + 2;
                uVar25 = uVar25 + 1;
              } while (uVar31 != uVar25);
            }
            lVar20 = lVar20 + (int)(uVar29 * 2);
            uVar43 = uVar30 + 2;
            iVar17 = uVar30 + 3;
            lVar28 = lVar28 + (int)(uVar29 * 2);
            uVar30 = uVar43;
          } while (iVar17 < (int)local_240);
        }
        if ((int)uVar43 < (int)local_240) {
          do {
            if (0 < (int)uVar29) {
              uVar25 = 0;
              do {
                puVar40[uVar25] = *(undefined1 *)(lVar20 + uVar25);
                uVar25 = uVar25 + 1;
              } while (uVar31 != uVar25);
              puVar40 = puVar40 + uVar25;
            }
            uVar43 = uVar43 + 1;
          } while (uVar43 != local_240);
        }
        uVar48 = uVar48 + 1;
      } while (uVar48 != uVar33);
    }
    goto LAB_00203454;
  }
  iVar49 = local_240 * uVar29;
  convolution_im2col_gemm_get_optimal_tile_mnk_int8
            (uVar43,0,iVar49,(int *)&local_f8,(int *)&local_20c,&local_1fc,opt->num_threads);
  iVar17 = (int)((int)local_f8.data + uVar43 + -1) / (int)local_f8.data;
  uVar30 = 8;
  if (opt->use_packing_layout == false) {
    uVar30 = 1;
  }
  if ((uVar48 & 7) != 0) {
    uVar30 = 1;
  }
  local_198.cstep = 0;
  local_198.data = (void *)0x0;
  local_198.refcount._0_4_ = 0;
  local_198.refcount._4_4_ = 0;
  local_198.elemsize._0_4_ = 0;
  local_198.elemsize._4_4_ = 0;
  local_198.elempack = 0;
  local_198.allocator = (Allocator *)0x0;
  local_198.dims = 0;
  local_198.w = 0;
  local_198.h = 0;
  local_198.d = 0;
  local_198.c = 0;
  if (uVar29 == 1) {
    Mat::reshape((Mat *)local_1f8,local_150,iVar49,uVar43,(Allocator *)0x0);
    piVar10 = (int *)CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + 1;
      UNLOCK();
    }
    piVar10 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_198.allocator == (Allocator *)0x0) {
          if (local_198.data != (void *)0x0) {
            free(local_198.data);
          }
        }
        else {
          (*(local_198.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar10 = (int *)CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
    local_198.data = (void *)local_1f8._0_8_;
    local_198.refcount._0_4_ = local_1f8._8_4_;
    local_198.refcount._4_4_ = local_1f8._12_4_;
    local_198.elemsize._0_4_ = local_1f8._16_4_;
    local_198.elemsize._4_4_ = local_1f8._20_4_;
    local_198.elempack = local_1f8._24_4_;
    local_198.allocator = (Allocator *)local_1f8._32_8_;
    local_198.dims = local_1d0._0_4_;
    local_198.w = local_1d0._4_4_;
    local_198.h = local_1d0._8_4_;
    local_198.d = local_1d0._12_4_;
    local_198.c = local_1c0;
    local_198.cstep = local_1b8;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if ((Allocator *)local_1f8._32_8_ == (Allocator *)0x0) {
          if ((void *)local_1f8._0_8_ != (void *)0x0) {
            free((void *)local_1f8._0_8_);
          }
        }
        else {
          (*(*(_func_int ***)local_1f8._32_8_)[3])();
        }
      }
    }
    local_1b8 = 0;
    local_1f8._0_8_ = (void *)0x0;
    local_1f8._8_4_ = 0;
    local_1f8._12_4_ = 0;
    local_1f8._16_4_ = 0;
    local_1f8._20_4_ = 0;
    local_1f8._24_4_ = 0;
    local_1d0 = ZEXT816(0);
    local_1c0 = 0;
  }
  else {
    Mat::reshape((Mat *)local_1f8,local_150,uVar29,local_240,uVar43,(Allocator *)0x0);
    Mat::create(&local_198,iVar49,uVar43,1,1,(Allocator *)0x0);
    if (0 < (int)uVar43) {
      uVar48 = 0;
      do {
        if ((int)uVar30 <= (int)local_240) {
          pvVar35 = (void *)((long)local_198.w * uVar48 *
                             CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize) +
                            (long)local_198.data);
          lVar20 = 0;
          do {
            if (0 < (int)uVar29) {
              uVar25 = 0;
              do {
                pvVar36 = pvVar35;
                uVar39 = 0;
                do {
                  *(undefined1 *)((long)pvVar36 + uVar39) =
                       *(undefined1 *)
                        (local_1f8._0_8_ +
                        uVar25 + (lVar20 + uVar39) * (long)(int)local_1d0._4_4_ *
                                 CONCAT44(local_1f8._20_4_,local_1f8._16_4_) +
                                 local_1b8 * uVar48 * CONCAT44(local_1f8._20_4_,local_1f8._16_4_));
                  uVar39 = uVar39 + 1;
                } while (uVar30 != uVar39);
                uVar25 = uVar25 + 1;
                pvVar35 = (void *)((long)pvVar36 + uVar39);
              } while (uVar25 != uVar31);
              pvVar35 = (void *)((long)pvVar36 + uVar39);
            }
            lVar20 = lVar20 + (ulong)uVar30;
          } while (lVar20 < (long)((long)(int)local_240 - (ulong)(uVar30 - 1)));
        }
        uVar48 = uVar48 + 1;
      } while (uVar48 != uVar33);
    }
    piVar10 = (int *)CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if ((Allocator *)local_1f8._32_8_ == (Allocator *)0x0) {
          if ((void *)local_1f8._0_8_ != (void *)0x0) {
            free((void *)local_1f8._0_8_);
          }
        }
        else {
          (*(*(_func_int ***)local_1f8._32_8_)[3])();
        }
      }
    }
  }
  iVar18 = local_1fc;
  if (local_1fc < 4) {
LAB_0020320b:
    Mat::create(&this->weight_sgemm_data,(int)local_f8.data * iVar18,(iVar49 + iVar18 + -1) / iVar18
                ,(int)((uVar43 - 1) + (int)local_f8.data) / (int)local_f8.data,1,1,(Allocator *)0x0)
    ;
  }
  else {
    iVar19 = cpu_support_x86_avx512_vnni();
    bVar16 = true;
    if (iVar19 == 0) {
      iVar19 = cpu_support_x86_avx_vnni();
      bVar16 = iVar19 != 0;
    }
    iVar19 = cpu_support_x86_avx_vnni_int8();
    if (!(bool)(bVar16 & iVar19 == 0)) goto LAB_0020320b;
    iVar19 = 0x40;
    if ((((int)local_f8.data < 0x10) && (iVar19 = 0x20, (int)local_f8.data < 8)) &&
       (iVar19 = 0x10, (int)local_f8.data < 4)) {
      iVar19 = (uint)(1 < (int)local_f8.data) * 4 + 4;
    }
    Mat::create(&this->weight_sgemm_data,(iVar19 + iVar18) * (int)local_f8.data,
                (iVar49 + iVar18 + -1) / iVar18,
                (int)((uVar43 - 1) + (int)local_f8.data) / (int)local_f8.data,1,1,(Allocator *)0x0);
  }
  if (0 < iVar17) {
    iVar18 = 0;
    do {
      iVar44 = (int)local_f8.data * iVar18;
      iVar19 = (int)local_1b0 - iVar44;
      if ((int)local_f8.data < iVar19) {
        iVar19 = (int)local_f8.data;
      }
      if (0 < iVar49) {
        iVar46 = 0;
        do {
          iVar12 = iVar49 - iVar46;
          if (local_1fc < iVar49 - iVar46) {
            iVar12 = local_1fc;
          }
          local_1d0._4_4_ = (this->weight_sgemm_data).w;
          local_1b8 = (size_t)(int)local_1d0._4_4_;
          sVar32 = (this->weight_sgemm_data).elemsize;
          local_1f8._24_4_ = (this->weight_sgemm_data).elempack;
          local_1f8._32_8_ = (this->weight_sgemm_data).allocator;
          local_1f8._0_8_ =
               (long)(this->weight_sgemm_data).data +
               sVar32 * local_1b8 * (long)(iVar46 / local_1fc) +
               (long)(iVar44 / (int)local_f8.data) * (this->weight_sgemm_data).cstep * sVar32;
          local_1f8._8_4_ = 0;
          local_1f8._12_4_ = 0;
          local_1f8._16_4_ = (undefined4)sVar32;
          local_1f8._20_4_ = (undefined4)(sVar32 >> 0x20);
          local_1d0._0_4_ = 2;
          local_1d0._8_8_ = 0x100000001;
          local_1c0 = 1;
          Gemm_x86_avx_utility::pack_A_tile_int8
                    (&local_198,(Mat *)local_1f8,iVar44,iVar19,iVar46,iVar12);
          piVar10 = (int *)CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if ((Allocator *)local_1f8._32_8_ == (Allocator *)0x0) {
                if ((void *)local_1f8._0_8_ != (void *)0x0) {
                  free((void *)local_1f8._0_8_);
                }
              }
              else {
                (*(*(_func_int ***)local_1f8._32_8_)[3])();
              }
            }
          }
          local_1b8 = 0;
          local_1f8._0_8_ = (void *)0x0;
          local_1f8._8_4_ = 0;
          local_1f8._12_4_ = 0;
          local_1f8._16_4_ = 0;
          local_1f8._20_4_ = 0;
          local_1f8._24_4_ = 0;
          local_1d0 = (undefined1  [16])0x0;
          local_1c0 = 0;
          iVar46 = iVar46 + local_1fc;
        } while (iVar46 < iVar49);
      }
      iVar18 = iVar18 + 1;
    } while (iVar18 != iVar17);
  }
  piVar10 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_198.allocator == (Allocator *)0x0) {
        if (local_198.data != (void *)0x0) {
          free(local_198.data);
        }
      }
      else {
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_198.cstep = 0;
  local_198.data = (void *)0x0;
  local_198.refcount._0_4_ = 0;
  local_198.refcount._4_4_ = 0;
  local_198.elemsize._0_4_ = 0;
  local_198.elemsize._4_4_ = 0;
  local_198.elempack = 0;
  local_198.dims = 0;
  local_198.w = 0;
  local_198.h = 0;
  local_198.d = 0;
  local_198.c = 0;
LAB_00203454:
  Mat::create(&this->scale_in_data,(this->super_Convolution).num_output,4,(Allocator *)0x0);
  lVar20 = (long)(this->super_Convolution).num_output;
  if (0 < lVar20) {
    pvVar35 = (this->super_Convolution).weight_data_int8_scales.data;
    pfVar9 = (float *)(this->super_Convolution).bottom_blob_int8_scales.data;
    pvVar36 = (this->scale_in_data).data;
    lVar28 = 0;
    do {
      fVar1 = *(float *)((long)pvVar35 + lVar28 * 4);
      fVar51 = 0.0;
      if (fVar1 != 0.0) {
        fVar51 = 1.0 / (fVar1 * *pfVar9);
      }
      *(float *)((long)pvVar36 + lVar28 * 4) = fVar51;
      lVar28 = lVar28 + 1;
    } while (lVar20 != lVar28);
  }
  if (local_110->lightmode != false) {
    piVar10 = (this->super_Convolution).weight_data.refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        pvVar35 = (this->super_Convolution).weight_data.data;
        pAVar11 = (this->super_Convolution).weight_data.allocator;
        if (pAVar11 == (Allocator *)0x0) {
          if (pvVar35 != (void *)0x0) {
            free(pvVar35);
          }
        }
        else {
          (*pAVar11->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution).weight_data.cstep = 0;
    *(undefined1 (*) [16])((long)&local_150->refcount + 4) = (undefined1  [16])0x0;
    local_150->data = (void *)0x0;
    local_150->refcount = (int *)0x0;
    (this->super_Convolution).weight_data.dims = 0;
    (this->super_Convolution).weight_data.w = 0;
    (this->super_Convolution).weight_data.h = 0;
    (this->super_Convolution).weight_data.d = 0;
    (this->super_Convolution).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_avx::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (opt.use_winograd43_convolution)
            conv3x3s1_winograd43_transform_kernel_int8(weight_data, weight_winograd43_data, num_input, num_output, opt);
        else
            conv3x3s1_winograd23_transform_kernel_int8(weight_data, weight_winograd23_data, num_input, num_output, opt);
    }
    else if (opt.use_sgemm_convolution)
    {
        convolution_im2col_gemm_transform_kernel_int8(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h, opt);
    }
    else
    {
        convolution_transform_kernel_packed_int8(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // requantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}